

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O3

void __thiscall libsbox::Pipe::Pipe(Pipe *this)

{
  uint __val;
  int iVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  uint uVar6;
  uint __len;
  string __str;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  __val = -Pipe::counter;
  if (0 < Pipe::counter) {
    __val = Pipe::counter;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar3 = (uint)uVar5;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_001300f2;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_001300f2;
      }
      if (uVar3 < 10000) goto LAB_001300f2;
      uVar5 = uVar5 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_001300f2:
  uVar6 = (uint)Pipe::counter >> 0x1f;
  iVar1 = Pipe::counter >> 0x1f;
  Pipe::counter = Pipe::counter + 1;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)iVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)uVar6 + (long)local_70[0]),__len,__val);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x14b058);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

Pipe::Pipe() {
    static int32_t counter = 0;
    name_ = "pipe-" + std::to_string(counter++);
}